

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConditionalStatements.h
# Opt level: O2

void __thiscall
slang::ast::CaseStatement::visitExprs<cast_signed_index::MainVisitor&>
          (CaseStatement *this,AlwaysFFVisitor *visitor)

{
  pointer ppEVar1;
  size_t sVar2;
  long lVar3;
  pointer pIVar4;
  ItemGroup *item;
  pointer pIVar5;
  
  Expression::visit<cast_signed_index::MainVisitor&>(this->expr,visitor);
  pIVar5 = (this->items)._M_ptr;
  pIVar4 = pIVar5 + (this->items)._M_extent._M_extent_value;
  for (; pIVar5 != pIVar4; pIVar5 = pIVar5 + 1) {
    ppEVar1 = (pIVar5->expressions)._M_ptr;
    sVar2 = (pIVar5->expressions)._M_extent._M_extent_value;
    for (lVar3 = 0; sVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
      Expression::visit<cast_signed_index::MainVisitor&>
                (*(Expression **)((long)ppEVar1 + lVar3),visitor);
    }
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        expr.visit(visitor);
        for (auto& item : items) {
            for (auto itemExpr : item.expressions)
                itemExpr->visit(visitor);
        }
    }